

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteDatabase::Close(SQLiteDatabase *this)

{
  int iVar1;
  runtime_error *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  int res;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_close(*(undefined8 *)(in_RDI + 200));
  if (iVar1 == 0) {
    *(undefined8 *)(in_RDI + 200) = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    sqlite3_errstr(iVar1);
    tinyformat::format<char_const*>
              (in_stack_ffffffffffffffb8,(char **)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Close()
{
    int res = sqlite3_close(m_db);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to close database: %s\n", sqlite3_errstr(res)));
    }
    m_db = nullptr;
}